

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O2

bool tinyusdz::detail::ParseValue<bool>(AsciiParser *parser,bool *ret,string *err)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  bool val;
  ostringstream ss_e;
  bool local_20a;
  allocator local_209;
  string local_208;
  string local_1e8;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  bVar1 = ascii::AsciiParser::ReadBasicType(parser,&local_20a);
  if (bVar1) {
    *ret = local_20a;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x84);
    ::std::operator<<(poVar2," ");
    ::std::__cxx11::string::string(local_1c8,"Failed to parse a value of type `{}`",&local_209);
    tinyusdz::value::TypeTraits<bool>::type_name_abi_cxx11_();
    fmt::format<std::__cxx11::string>(&local_208,(fmt *)local_1c8,&local_1e8,in_RCX);
    poVar2 = ::std::operator<<((ostream *)local_1a8,(string *)&local_208);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  return bVar1;
}

Assistant:

bool ParseValue<bool>(tinyusdz::ascii::AsciiParser &parser, bool &ret,
                      std::string *err) {
  bool val;
  if (!parser.ReadBasicType(&val)) {
    PUSH_ERROR_AND_RETURN(fmt::format("Failed to parse a value of type `{}`",
                                      value::TypeTraits<bool>::type_name()));
  }

  ret = val;

  return true;
}